

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O0

void olsrv2_tc_node_remove(olsrv2_tc_node *node)

{
  list_entity *plVar1;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  olsrv2_tc_attachment *net_it;
  olsrv2_tc_attachment *net;
  olsrv2_tc_edge *edge_it;
  olsrv2_tc_edge *edge;
  olsrv2_tc_node *node_local;
  
  oonf_class_event(&_tc_node_class,node,2);
  plVar1 = (node->_edges).list_head.next;
  edge_it = (olsrv2_tc_edge *)(plVar1 + -3);
  plVar1 = plVar1->next;
  while( true ) {
    net = (olsrv2_tc_attachment *)(plVar1 + -3);
    if ((edge_it->_node).list.prev == (node->_edges).list_head.prev) break;
    olsrv2_tc_edge_remove(edge_it);
    edge_it = (olsrv2_tc_edge *)net;
    plVar1 = plVar1->next;
  }
  plVar1 = (node->_attached_networks).list_head.next;
  net_it = (olsrv2_tc_attachment *)&plVar1[-3].prev;
  plVar1 = plVar1->next;
  while( true ) {
    __tempptr = (list_entity *)&plVar1[-3].prev;
    if ((net_it->_src_node).list.prev == (node->_attached_networks).list_head.prev) break;
    olsrv2_tc_endpoint_remove(net_it);
    net_it = (olsrv2_tc_attachment *)__tempptr;
    plVar1 = plVar1->next;
  }
  oonf_timer_stop(&node->_validity_time);
  if (((node->_edges).count == 0) && ((node->direct_neighbor & 1U) == 0)) {
    avl_remove(&_tc_tree,&node->_originator_node);
    oonf_class_free(&_tc_node_class,node);
  }
  olsrv2_routing_domain_changed((nhdp_domain *)0x0,true);
  return;
}

Assistant:

void
olsrv2_tc_node_remove(struct olsrv2_tc_node *node) {
  struct olsrv2_tc_edge *edge, *edge_it;
  struct olsrv2_tc_attachment *net, *net_it;

  oonf_class_event(&_tc_node_class, node, OONF_OBJECT_REMOVED);

  /* remove tc_edges */
  avl_for_each_element_safe(&node->_edges, edge, _node, edge_it) {
    /* some edges might just become virtual */
    olsrv2_tc_edge_remove(edge);
  }

  /* remove attached networks */
  avl_for_each_element_safe(&node->_attached_networks, net, _src_node, net_it) {
    olsrv2_tc_endpoint_remove(net);
  }

  /* stop validity timer */
  oonf_timer_stop(&node->_validity_time);

  /* remove from global tree and free memory if node is not needed anymore*/
  if (node->_edges.count == 0 && !node->direct_neighbor) {
    avl_remove(&_tc_tree, &node->_originator_node);
    oonf_class_free(&_tc_node_class, node);
  }

  /* all domains might have changed */
  olsrv2_routing_domain_changed(NULL, true);
}